

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::eval_rightShift_ivec2(ShaderEvalContext *c)

{
  undefined8 uVar1;
  Vector<float,_2> local_60;
  Vector<int,_2> local_58;
  Vector<float,_2> local_50;
  Vector<int,_2> local_48;
  Vector<int,_2> local_40;
  Vector<float,_2> local_38;
  VecAccess<float,_4,_2> local_30;
  
  local_50.m_data[1] = c->in[0].m_data[1];
  local_50.m_data[0] = c->in[0].m_data[3];
  tcu::Vector<float,_2>::cast<int>(&local_50);
  uVar1 = *(undefined8 *)c->in[1].m_data;
  local_60.m_data[1] = (float)uVar1;
  local_60.m_data[0] = (float)((ulong)uVar1 >> 0x20);
  tcu::Vector<float,_2>::cast<int>(&local_60);
  sr::(anonymous_namespace)::rightShift<int,2>(&local_48,&local_58);
  tcu::Vector<int,_2>::cast<float>(&local_40);
  local_30.m_vector = &c->color;
  local_30.m_index[0] = 1;
  local_30.m_index[1] = 2;
  tcu::VecAccess<float,_4,_2>::operator=(&local_30,&local_38);
  return;
}

Assistant:

void eval_rightShift_int	(ShaderEvalContext& c) { c.color.x()	= (float)rightShift((int)c.in[0].z(),				(int)c.in[1].x()); }